

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  byte *pbVar1;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  undefined8 *puVar4;
  FILEPROTO *pFVar5;
  WildcardData *pWVar6;
  connectdata *pcVar7;
  byte bVar8;
  _Bool connected;
  CURLcode CVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  ftp_wc *pfVar13;
  ftp_parselist_data *pfVar14;
  uchar uVar15;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  if (((data->state).field_0x74c & 0x40) != 0) {
    pWVar3 = data->wildcard;
    pcVar2 = data->conn;
switchD_001306df_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_001306df_caseD_0;
    case '\x01':
      pFVar5 = (data->req).p.file;
      pcVar10 = pFVar5->path;
      pWVar6 = data->wildcard;
      pcVar12 = strrchr(pcVar10,0x2f);
      if (pcVar12 == (char *)0x0) {
        if (*pcVar10 != '\0') {
          pcVar12 = (*Curl_cstrdup)(pcVar10);
          pWVar6->pattern = pcVar12;
          goto LAB_00130964;
        }
LAB_001309ee:
        pWVar6->state = '\x04';
        CVar9 = ftp_parse_url_path(data);
      }
      else {
        if (pcVar12[1] == '\0') goto LAB_001309ee;
        pcVar10 = pcVar12 + 1;
        pcVar12 = (*Curl_cstrdup)(pcVar10);
        pWVar6->pattern = pcVar12;
LAB_00130964:
        if (pcVar12 == (char *)0x0) {
          CVar9 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar10 = '\0';
          pfVar13 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          if (pfVar13 == (ftp_wc *)0x0) {
            CVar9 = CURLE_OUT_OF_MEMORY;
          }
          else {
            pfVar14 = Curl_ftp_parselist_data_alloc();
            pfVar13->parser = pfVar14;
            CVar9 = CURLE_OUT_OF_MEMORY;
            if (pfVar14 != (ftp_parselist_data *)0x0) {
              pWVar6->ftpwc = pfVar13;
              pWVar6->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              CVar9 = ftp_parse_url_path(data);
              if (CVar9 == CURLE_OK) {
                pcVar10 = (*Curl_cstrdup)(pFVar5->path);
                pWVar6->path = pcVar10;
                CVar9 = CURLE_OUT_OF_MEMORY;
                if (pcVar10 != (char *)0x0) {
                  (pfVar13->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar13->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  CVar9 = CURLE_OK;
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    CVar9 = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_00130a48;
                }
              }
            }
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar13);
            (*Curl_cfree)(pfVar13);
          }
          (*Curl_cfree)(pWVar6->pattern);
          pWVar6->pattern = (char *)0x0;
          pWVar6->ftpwc = (ftp_wc *)0x0;
          pWVar6->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_00130a48:
      if (pWVar3->state != '\x04') {
        bVar8 = (CVar9 != CURLE_OK) << 2 | 2;
        goto LAB_00130a59;
      }
      goto LAB_00130a5c;
    case '\x02':
      pfVar13 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar13->backup).write_function;
      (data->set).out = (pfVar13->backup).file_descriptor;
      (pfVar13->backup).write_function = (curl_write_callback)0x0;
      (pfVar13->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar9 = Curl_ftp_parselist_geterror(pfVar13->parser);
      uVar15 = '\x04';
      if (CVar9 == CURLE_OK) {
        if ((pWVar3->filelist).size == 0) {
          pWVar3->state = '\x04';
          CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_00130a5c;
        }
        goto switchD_001306df_default;
      }
      break;
    case '\x03':
      puVar4 = (undefined8 *)((pWVar3->filelist).head)->ptr;
      pFVar5 = (data->req).p.file;
      pcVar10 = curl_maprintf("%s%s",pWVar3->path,*puVar4);
      if (pcVar10 == (char *)0x0) {
        CVar9 = CURLE_OUT_OF_MEMORY;
        goto LAB_00130a5c;
      }
      (*Curl_cfree)(pFVar5->freepath);
      pFVar5->path = pcVar10;
      pFVar5->freepath = pcVar10;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"Wildcard - START of \"%s\"",*puVar4);
      }
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        lVar11 = (*(data->set).chunk_bgn)
                           (puVar4,(data->set).wildcardptr,(int)(pWVar3->filelist).size);
        Curl_set_in_callback(data,false);
        if (lVar11 == 2) {
          uVar15 = '\x05';
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar4);
          }
          break;
        }
        if (lVar11 == 1) {
          CVar9 = CURLE_CHUNK_FAILED;
          goto LAB_00130a5c;
        }
      }
      uVar15 = '\x05';
      if (*(int *)(puVar4 + 1) == 0) {
        if ((*(byte *)(puVar4 + 0xc) & 0x40) != 0) {
          (pcVar2->proto).ftpc.known_filesize = puVar4[5];
        }
        CVar9 = ftp_parse_url_path(data);
        if (CVar9 == CURLE_OK) {
          Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
          CVar9 = CURLE_OK;
          if ((pWVar3->filelist).size == 0) {
            pWVar3->state = '\x04';
            CVar9 = CURLE_OK;
          }
        }
        goto LAB_00130a5c;
      }
      break;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        bVar8 = 7;
        CVar9 = CURLE_OK;
      }
      else {
        CVar9 = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
        bVar8 = CVar9 == CURLE_OK | 6;
      }
LAB_00130a59:
      pWVar3->state = bVar8;
      goto LAB_00130a5c;
    case '\x05':
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(data->set).chunk_end)((data->set).wildcardptr);
        Curl_set_in_callback(data,false);
      }
      Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
      uVar15 = ((pWVar3->filelist).size == 0) + '\x03';
      break;
    default:
      goto switchD_001306df_default;
    }
    pWVar3->state = uVar15;
    goto switchD_001306df_default;
  }
  CVar9 = ftp_parse_url_path(data);
joined_r0x00130a7f:
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if (((data->req).field_0xbc & 0x10) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar9 = ftp_state_quote(data,true,'\f');
  if (CVar9 == CURLE_OK) {
    pcVar7 = data->conn;
    CVar9 = Curl_pp_statemach(data,&(pcVar7->proto).ftpc.pp,false,false);
    *done = (pcVar7->proto).ftpc.state == '\0';
    connected = Curl_conn_is_connected(data->conn,1);
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
    }
    if (CVar9 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar9 = ftp_dophase_done(data,connected);
      return CVar9;
    }
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar9;
switchD_001306df_caseD_0:
  CVar9 = CURLE_OK;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_00130a5c:
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x00130a7f;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}